

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

natwm_error event_subscribe_to_root(natwm_state *state)

{
  void *__ptr;
  undefined8 in_R8;
  undefined8 in_R9;
  xcb_generic_error_t *error;
  xcb_void_cookie_t cookie;
  xcb_event_mask_t root_mask;
  natwm_state *state_local;
  
  error._4_4_ = 0x180000;
  _cookie = state;
  error._0_4_ = xcb_change_window_attributes_checked
                          (state->xcb,state->screen->root,0x800,(long)&error + 4,in_R8,in_R9,
                           0x10a641);
  __ptr = (void *)xcb_request_check(_cookie->xcb,error._0_4_);
  xcb_flush(_cookie->xcb);
  if (__ptr == (void *)0x0) {
    state_local._4_4_ = NO_ERROR;
  }
  else {
    free(__ptr);
    state_local._4_4_ = RESOLUTION_FAILURE;
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error event_subscribe_to_root(const struct natwm_state *state)
{
        xcb_event_mask_t root_mask
                = XCB_EVENT_MASK_SUBSTRUCTURE_NOTIFY | XCB_EVENT_MASK_SUBSTRUCTURE_REDIRECT;
        xcb_void_cookie_t cookie = xcb_change_window_attributes_checked(
                state->xcb, state->screen->root, XCB_CW_EVENT_MASK, &root_mask);
        xcb_generic_error_t *error = xcb_request_check(state->xcb, cookie);

        xcb_flush(state->xcb);

        if (error != XCB_NONE) {
                // We will fail if there is already a window manager present
                free(error);

                return RESOLUTION_FAILURE;
        }

        return NO_ERROR;
}